

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_text.cpp
# Opt level: O2

void __thiscall
flatbuffers::JsonPrinter::PrintScalar<unsigned_long>
          (JsonPrinter *this,unsigned_long val,Type *type,int param_3)

{
  EnumDef *this_00;
  pointer ppEVar1;
  string *psVar2;
  EnumVal *pEVar3;
  Value *pVVar4;
  pointer ppEVar5;
  ulong uVar6;
  allocator<char> local_59;
  size_type local_58;
  string local_50;
  
  if (type->base_type == BASE_TYPE_BOOL) {
    std::__cxx11::string::append((char *)this->text);
    return;
  }
  if ((this->opts->output_enum_identifiers == true) &&
     (this_00 = type->enum_def, this_00 != (EnumDef *)0x0)) {
    pEVar3 = EnumDef::ReverseLookup(this_00,val,false);
    if (pEVar3 != (EnumVal *)0x0) {
      std::__cxx11::string::push_back((char)this->text);
      std::__cxx11::string::append((string *)this->text);
      std::__cxx11::string::push_back((char)this->text);
      return;
    }
    if (val != 0) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"bit_flags",&local_59);
      pVVar4 = SymbolTable<flatbuffers::Value>::Lookup
                         (&(this_00->super_Definition).attributes,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      if (pVVar4 != (Value *)0x0) {
        local_58 = this->text->_M_string_length;
        std::__cxx11::string::push_back((char)this->text);
        ppEVar1 = (this_00->vals).vec.
                  super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        uVar6 = 0;
        for (ppEVar5 = (this_00->vals).vec.
                       super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                       ._M_impl.super__Vector_impl_data._M_start; ppEVar5 != ppEVar1;
            ppEVar5 = ppEVar5 + 1) {
          if (((*ppEVar5)->value & val) != 0) {
            uVar6 = uVar6 | (*ppEVar5)->value;
            std::__cxx11::string::append((string *)this->text);
            std::__cxx11::string::push_back((char)this->text);
          }
        }
        psVar2 = this->text;
        if (uVar6 == val) {
          (psVar2->_M_dataplus)._M_p[psVar2->_M_string_length - 1] = '\"';
          return;
        }
        std::__cxx11::string::resize((ulong)psVar2);
      }
    }
  }
  NumToString<unsigned_long>(&local_50,val);
  std::__cxx11::string::append((string *)this->text);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void PrintScalar(T val, const Type &type, int /*indent*/) {
    if (IsBool(type.base_type)) {
      text += val != 0 ? "true" : "false";
      return;  // done
    }

    if (opts.output_enum_identifiers && type.enum_def) {
      const auto &enum_def = *type.enum_def;
      if (auto ev = enum_def.ReverseLookup(static_cast<int64_t>(val))) {
        text += '\"';
        text += ev->name;
        text += '\"';
        return;  // done
      } else if (val && enum_def.attributes.Lookup("bit_flags")) {
        const auto entry_len = text.length();
        const auto u64 = static_cast<uint64_t>(val);
        uint64_t mask = 0;
        text += '\"';
        for (auto it = enum_def.Vals().begin(), e = enum_def.Vals().end();
             it != e; ++it) {
          auto f = (*it)->GetAsUInt64();
          if (f & u64) {
            mask |= f;
            text += (*it)->name;
            text += ' ';
          }
        }
        // Don't slice if (u64 != mask)
        if (mask && (u64 == mask)) {
          text[text.length() - 1] = '\"';
          return;  // done
        }
        text.resize(entry_len);  // restore
      }
      // print as numeric value
    }

    text += NumToString(val);
    return;
  }